

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregoimp.cpp
# Opt level: O1

double icu_63::Grego::fieldsToDay(int32_t year,int32_t month,int32_t dom)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar2 = year + -1;
  if (year < 1) {
    iVar1 = year + 3;
    if (-1 < year) {
      iVar1 = year;
    }
    iVar1 = (iVar1 >> 2) + -1;
  }
  else {
    iVar1 = year + 2;
    if (-1 < iVar2) {
      iVar1 = iVar2;
    }
    iVar1 = iVar1 >> 2;
  }
  if (year < 1) {
    iVar4 = year / 400 + -1;
    iVar5 = (int)((ulong)((long)year * -0x51eb851f) >> 0x20);
    iVar5 = ((iVar5 >> 5) - (iVar5 >> 0x1f)) + 1;
  }
  else {
    iVar4 = iVar2 / 400;
    iVar5 = (int)((ulong)((long)iVar2 * -0x51eb851f) >> 0x20);
    iVar5 = (iVar5 >> 5) - (iVar5 >> 0x1f);
  }
  iVar6 = 0;
  if ((year & 3U) == 0) {
    uVar3 = year * -0x3d70a3d7 + 0x51eb850;
    iVar6 = 0xc;
    if ((uVar3 >> 2 | year * 0x40000000) < 0x28f5c29) {
      iVar6 = 0xc;
      if (0xa3d70a < (uVar3 >> 4 | year * -0x70000000)) {
        iVar6 = 0;
      }
    }
  }
  return (double)((int)*(short *)(DAYS_BEFORE + (long)(iVar6 + month) * 2) +
                  iVar2 * 0x16d + dom + iVar1 + iVar4 + iVar5 + 0x1a4451) + -2440588.0;
}

Assistant:

double Grego::fieldsToDay(int32_t year, int32_t month, int32_t dom) {

    int32_t y = year - 1;

    double julian = 365 * y + ClockMath::floorDivide(y, 4) + (JULIAN_1_CE - 3) + // Julian cal
        ClockMath::floorDivide(y, 400) - ClockMath::floorDivide(y, 100) + 2 + // => Gregorian cal
        DAYS_BEFORE[month + (isLeapYear(year) ? 12 : 0)] + dom; // => month/dom

    return julian - JULIAN_1970_CE; // JD => epoch day
}